

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

bool ExecuteCommands(vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *commands,
                    JSONRPCRequest *request,UniValue *result)

{
  pointer ppCVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  undefined4 *puVar3;
  VType *pVVar4;
  pointer pcVar5;
  string key;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  undefined1 auVar6 [16];
  char cVar7;
  bool bVar8;
  pointer pUVar9;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar10;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
  __it;
  UniValue *pUVar11;
  UniValue *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  UniValue *pUVar13;
  long *plVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  pointer pUVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string *argName;
  long lVar18;
  int iVar19;
  long lVar20;
  pointer pbVar21;
  char *in_R8;
  size_t index;
  ulong uVar22;
  long in_FS_OFFSET;
  byte bVar23;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_false,_true>,_bool>
  pVar24;
  undefined1 auVar25 [16];
  string_view separators;
  RPCCommandExecution execution;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargNames;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>_>
  argsIn;
  size_t i;
  node_type positional_args;
  undefined4 in_stack_fffffffffffffa78;
  int iVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  UniValue *this;
  long lVar27;
  pointer pUVar28;
  UniValue *pUVar29;
  string *method;
  pointer pUVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar31;
  _Hash_node_base in_stack_fffffffffffffae0;
  undefined8 in_stack_fffffffffffffae8;
  undefined8 uVar32;
  undefined8 local_510;
  undefined1 local_500 [184];
  undefined1 local_448 [72];
  pointer pUStack_400;
  pointer local_3f8;
  VType local_370;
  long *local_368 [2];
  long local_358 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  vector<UniValue,_std::allocator<UniValue>_> local_330;
  undefined1 *local_318;
  undefined8 local_310;
  undefined1 local_308;
  uint7 uStack_307;
  pointer pcStack_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  undefined1 auStack_2e0 [16];
  undefined1 local_2d0 [24];
  vector<UniValue,_std::allocator<UniValue>_> vStack_2b8;
  VType local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  pointer local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  vector<UniValue,_std::allocator<UniValue>_> local_258;
  undefined4 local_240;
  long *local_238 [2];
  long local_228 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  vector<UniValue,_std::allocator<UniValue>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined4 local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_188;
  undefined4 local_170;
  long *local_168 [2];
  long local_158 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<UniValue,_std::allocator<UniValue>_> local_130;
  long *local_118 [2];
  long local_108 [2];
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  pointer local_d0;
  pointer local_c8;
  undefined1 local_c0 [40];
  pointer pUStack_98;
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  undefined1 auStack_78 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<UniValue,_std::allocator<UniValue>_> vStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar9 = (pointer)(commands->
                    super__Vector_base<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  pUVar30 = (pointer)(commands->
                     super__Vector_base<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
  bVar23 = pUVar9 != pUVar30;
  if ((bool)bVar23) {
    method = &request->strMethod;
    pUVar13 = &request->params;
    this = (UniValue *)local_448;
    __return_storage_ptr__ = (UniValue *)local_500;
    do {
      __it._M_cur = (__node_type *)&stack0xfffffffffffffae0;
      lVar27 = *(long *)pUVar9;
      ppCVar1 = (commands->
                super__Vector_base<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      RPCCommandExecution::RPCCommandExecution((RPCCommandExecution *)__it._M_cur,method);
      pUVar28 = (pointer)(ppCVar1 + -1);
      if (pUVar13->typ == VOBJ) {
        JSONRPCRequest::JSONRPCRequest((JSONRPCRequest *)(local_500 + 0x38),request);
        local_c0._16_8_ = local_c0 + 0x20;
        local_90._0_4_ = 2;
        local_90._8_8_ = local_80 + 8;
        auStack_78._0_8_ = (ulong)(uint7)local_c0._33_7_ << 8;
        auStack_78._8_8_ = pUStack_98;
        local_80 = (undefined1  [8])0x0;
        local_c0._24_8_ = 0;
        local_c0[0x20] = '\0';
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_448._0_4_ = VARR;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_448 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_90 + 8));
        local_2e8 = (undefined1  [8])local_448._56_8_;
        local_2f8._8_8_ = local_448._48_8_;
        local_2f8._0_8_ = local_448._40_8_;
        local_448._40_8_ =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_448._48_8_ =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_448._56_8_ =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f8);
        local_2e8 = (undefined1  [8])local_3f8;
        local_2f8._8_8_ = pUStack_400;
        local_2f8._0_8_ = local_448._64_8_;
        local_448._64_8_ =
             vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        pUStack_400 = vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
        local_3f8 = vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                  ((vector<UniValue,_std::allocator<UniValue>_> *)local_2f8);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if ((pointer)local_90._8_8_ != (pointer)(local_80 + 8)) {
          operator_delete((void *)local_90._8_8_,(ulong)(auStack_78._0_8_ + 1));
        }
        if ((pointer)local_c0._16_8_ != (pointer)(local_c0 + 0x20)) {
          operator_delete((void *)local_c0._16_8_,CONCAT71(local_c0._33_7_,local_c0[0x20]) + 1);
        }
        pvVar15 = UniValue::getKeys_abi_cxx11_(pUVar13);
        in_stack_fffffffffffffa78 = CONCAT13(bVar23,(int3)in_stack_fffffffffffffa78);
        pvVar10 = UniValue::getValues(pUVar13);
        local_500._0_8_ = local_500 + 0x30;
        local_500._8_8_ = (pointer)0x1;
        local_500._16_8_ = 0;
        local_500._24_8_ = 0;
        local_500._32_4_ = 0x3f800000;
        local_500._40_8_ = (pointer)0x0;
        local_500._48_8_ = (pointer)0x0;
        pbVar21 = (pvVar15->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((pvVar15->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != pbVar21) {
          lVar20 = 0;
          lVar18 = 0;
          uVar22 = 0;
          do {
            local_90._0_8_ =
                 (long)&((pvVar10->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                         super__Vector_impl_data._M_start)->typ + lVar20;
            pVar24 = std::
                     _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,UniValue_const*>,std::allocator<std::pair<std::__cxx11::string_const,UniValue_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                     ::_M_emplace<std::__cxx11::string_const&,UniValue_const*>
                               ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,UniValue_const*>,std::allocator<std::pair<std::__cxx11::string_const,UniValue_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                 *)__return_storage_ptr__,
                                (long)&(pbVar21->_M_dataplus)._M_p + lVar18,local_90);
            if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2f8,"Parameter ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&(((pvVar15->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar18));
              pbVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2f8," specified multiple times");
              local_90._0_8_ = (pbVar12->_M_dataplus)._M_p;
              paVar17 = &pbVar12->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._0_8_ == paVar17) {
                local_80 = (undefined1  [8])paVar17->_M_allocated_capacity;
                auStack_78._0_8_ = *(ulong *)((long)&pbVar12->field_2 + 8);
                local_90._0_8_ = (pointer)(local_90 + 0x10);
              }
              else {
                local_80 = (undefined1  [8])paVar17->_M_allocated_capacity;
              }
              local_90._8_8_ = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar17;
              pbVar12->_M_string_length = 0;
              (pbVar12->field_2)._M_local_buf[0] = '\0';
              JSONRPCError(pUVar13,-8,(string *)local_90);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                __cxa_throw(pUVar13,&UniValue::typeinfo,UniValue::~UniValue);
              }
              goto LAB_00ac595f;
            }
            uVar22 = uVar22 + 1;
            pbVar21 = (pvVar15->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar18 = lVar18 + 0x20;
            lVar20 = lVar20 + 0x58;
          } while (uVar22 < (ulong)((long)(pvVar15->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pbVar21 >> 5));
        }
        pUVar16 = (pointer)local_c0;
        local_90._0_4_ = 1;
        local_90._8_8_ = local_80 + 8;
        auStack_78._0_8_ = (ulong)(uint7)local_c0._1_7_ << 8;
        auStack_78._8_8_ = local_c0._8_8_;
        local_80 = (undefined1  [8])0x0;
        local_c8 = (pointer)0x0;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_c0[0] = VNULL;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pbVar12 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   (lVar27 + 0x60);
        pbVar31 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   (lVar27 + 0x68);
        iVar26 = 0;
        local_d0 = pUVar16;
        if (pbVar12 != pbVar31) {
          iVar19 = 0;
          iVar26 = 0;
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          do {
            local_2f8._0_8_ = (pbVar12->_M_dataplus)._M_p;
            local_2f8._8_8_ = pbVar12->_M_string_length;
            local_f8[0] = 0x7c;
            pUVar16 = (pointer)local_f8;
            separators._M_str = in_R8;
            separators._M_len = (size_t)pUVar16;
            util::Split<std::__cxx11::string>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xfffffffffffffae8,(util *)local_2f8,(Span<const_char> *)0x1,
                       separators);
            uVar32 = in_stack_fffffffffffffae8;
            if (in_stack_fffffffffffffae8 == local_510) {
              __it._M_cur = (__node_type *)0x0;
            }
            else {
              do {
                __it._M_cur = (__node_type *)
                              std::
                              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                      *)__return_storage_ptr__,(key_type *)in_stack_fffffffffffffae8
                                    );
                if (__it._M_cur != (__node_type *)0x0) break;
                in_stack_fffffffffffffae8 = in_stack_fffffffffffffae8 + 0x20;
              } while (in_stack_fffffffffffffae8 != local_510);
            }
            in_stack_fffffffffffffae8 = uVar32;
            if (*(char *)&pbVar12[1]._M_dataplus._M_p == '\x01') {
              if (__it._M_cur != (__node_type *)0x0) {
                bVar8 = UniValue::findKey((UniValue *)local_90,
                                          (string *)
                                          &(__it._M_cur)->
                                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                                          ,(size_t *)local_2f8);
                if (bVar8) {
                  pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f8,"Parameter ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&(__it._M_cur)->
                                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                                );
                  pbVar12 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_f8," specified multiple times");
                  local_2f8._0_8_ = (pbVar12->_M_dataplus)._M_p;
                  paVar17 = &pbVar12->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f8._0_8_ == paVar17) {
                    local_2e8 = (undefined1  [8])paVar17->_M_allocated_capacity;
                    auStack_2e0._0_8_ = *(long *)((long)&pbVar12->field_2 + 8);
                    local_2f8._0_8_ = (pointer)local_2e8;
                  }
                  else {
                    local_2e8 = (undefined1  [8])paVar17->_M_allocated_capacity;
                  }
                  local_2f8._8_8_ = pbVar12->_M_string_length;
                  (pbVar12->_M_dataplus)._M_p = (pointer)paVar17;
                  pbVar12->_M_string_length = 0;
                  (pbVar12->field_2)._M_local_buf[0] = '\0';
                  JSONRPCError(pUVar13,-8,(string *)local_2f8);
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    __cxa_throw(pUVar13,&UniValue::typeinfo,UniValue::~UniValue);
                  }
                  goto LAB_00ac595f;
                }
                local_118[0] = local_108;
                aVar2 = ((__it._M_cur)->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>
                        ._M_storage._M_storage.__align;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_118,aVar2,
                           *(long *)((long)&((__it._M_cur)->
                                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>
                                            ._M_storage._M_storage + 8) + (long)aVar2);
                puVar3 = *(undefined4 **)
                          ((long)&((__it._M_cur)->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>
                                  ._M_storage._M_storage + 0x20);
                local_170 = *puVar3;
                local_168[0] = local_158;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_168,*(long *)(puVar3 + 2),
                           *(long *)(puVar3 + 4) + *(long *)(puVar3 + 2));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_148,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(puVar3 + 10));
                std::vector<UniValue,_std::allocator<UniValue>_>::vector
                          (&local_130,(vector<UniValue,_std::allocator<UniValue>_> *)(puVar3 + 0x10)
                          );
                key._M_dataplus._M_p._4_4_ = iVar26;
                key._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa78;
                key._M_string_length = (size_type)__rhs;
                key.field_2._M_allocated_capacity = (size_type)this;
                key.field_2._8_8_ = pUVar9;
                val_03.val._M_dataplus._M_p = (pointer)request;
                val_03._0_8_ = lVar27;
                val_03.val._M_string_length = (size_type)result;
                val_03.val.field_2._M_allocated_capacity = (size_type)pUVar28;
                val_03.val.field_2._8_8_ = pUVar13;
                val_03.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = method;
                val_03.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar30;
                val_03.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)commands;
                val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pbVar31;
                val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffae0._M_nxt;
                val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffae8;
                UniValue::pushKVEnd((UniValue *)local_90,key,val_03);
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_130);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_148);
                if (local_168[0] != local_158) {
                  operator_delete(local_168[0],local_158[0] + 1);
                }
                if (local_118[0] != local_108) {
                  operator_delete(local_118[0],local_108[0] + 1);
                }
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)__return_storage_ptr__,(const_iterator)__it._M_cur);
              }
            }
            else {
              if ((vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish ==
                   vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_start) && (__it._M_cur == (__node_type *)0x0)) {
                iVar19 = iVar19 + 1;
                if (pUStack_400 == (pointer)local_448._64_8_) {
                  iVar26 = iVar19;
                }
              }
              else {
                if (0 < iVar19) {
                  do {
                    local_1b8 = 0;
                    local_1b0 = 0;
                    local_1c8 = 0;
                    vStack_188.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    vStack_188.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_1a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    vStack_188.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_1a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_1a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    val._4_4_ = iVar26;
                    val.typ = in_stack_fffffffffffffa78;
                    val.val._M_dataplus._M_p = (pointer)__rhs;
                    val.val._M_string_length = (size_type)this;
                    val.val.field_2._M_allocated_capacity = (size_type)pUVar9;
                    val.val.field_2._8_8_ = lVar27;
                    val.keys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)request;
                    val.keys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)result;
                    val.keys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pUVar28;
                    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_start = pUVar13;
                    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)method;
                    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = pUVar30;
                    local_1c0 = &local_1b0;
                    UniValue::push_back(this,val);
                    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_188);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_1a0);
                    if (local_1c0 != &local_1b0) {
                      operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
                    }
                    iVar19 = iVar19 + -1;
                  } while (iVar19 != 0);
                }
                if (__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0) {
                  __rhs = pbVar12;
                }
                iVar19 = 0;
              }
              if (__it._M_cur != (__node_type *)0x0) {
                if (vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_start) goto LAB_00ac4eca;
                puVar3 = *(undefined4 **)
                          ((long)&((__it._M_cur)->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>
                                  ._M_storage._M_storage + 0x20);
                local_240 = *puVar3;
                local_238[0] = local_228;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_238,*(long *)(puVar3 + 2),
                           *(long *)(puVar3 + 4) + *(long *)(puVar3 + 2));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_218,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(puVar3 + 10));
                std::vector<UniValue,_std::allocator<UniValue>_>::vector
                          (&local_200,(vector<UniValue,_std::allocator<UniValue>_> *)(puVar3 + 0x10)
                          );
                val_00._4_4_ = iVar26;
                val_00.typ = in_stack_fffffffffffffa78;
                val_00.val._M_dataplus._M_p = (pointer)__rhs;
                val_00.val._M_string_length = (size_type)this;
                val_00.val.field_2._M_allocated_capacity = (size_type)pUVar9;
                val_00.val.field_2._8_8_ = lVar27;
                val_00.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)request;
                val_00.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)result;
                val_00.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pUVar28;
                val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = pUVar13;
                val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)method;
                val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = pUVar30;
                UniValue::push_back(this,val_00);
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_200);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_218);
                if (local_238[0] != local_228) {
                  operator_delete(local_238[0],local_228[0] + 1);
                }
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)__return_storage_ptr__,(const_iterator)__it._M_cur);
              }
              pUVar16 = vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                local_298 = local_90._0_4_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._8_8_ ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_80 + 8)) {
                  local_280._8_8_ = auStack_78._8_8_;
                  local_290 = &local_280;
                }
                else {
                  local_290 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_90._8_8_;
                }
                local_280._M_allocated_capacity = auStack_78._0_8_;
                local_288 = (pointer)local_80;
                local_80 = (undefined1  [8])0x0;
                auStack_78._0_8_ = auStack_78._0_8_ & 0xffffffffffffff00;
                local_270.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_270.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_270.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_258.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start =
                     vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_258.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_258.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                val_01._4_4_ = iVar26;
                val_01.typ = in_stack_fffffffffffffa78;
                val_01.val._M_dataplus._M_p = (pointer)__rhs;
                val_01.val._M_string_length = (size_type)this;
                val_01.val.field_2._M_allocated_capacity = (size_type)pUVar9;
                val_01.val.field_2._8_8_ = lVar27;
                val_01.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)request;
                val_01.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)result;
                val_01.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pUVar28;
                val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = pUVar13;
                val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)method;
                val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = pUVar30;
                local_90._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_80 + 8);
                UniValue::push_back(this,val_01);
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_258);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_270);
                if (local_290 != &local_280) {
                  operator_delete(local_290,(ulong)(local_280._M_allocated_capacity + 1));
                }
                local_318 = &local_308;
                local_2f8._0_4_ = 1;
                local_2f8._8_8_ = auStack_2e0;
                auStack_2e0._0_8_ = (ulong)uStack_307 << 8;
                auStack_2e0._8_8_ = pcStack_300;
                local_2e8 = (undefined1  [8])0x0;
                local_310 = 0;
                local_308 = 0;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_2d0._16_8_ = (pointer)0x0;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_2d0._0_8_ = (pointer)0x0;
                local_2d0._8_8_ = (pointer)0x0;
                local_90._0_4_ = 1;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_90 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_2f8 + 8));
                local_f8._16_8_ =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_f8._8_8_ =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_f8._0_8_ =
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2d0._0_8_;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d0._8_8_;
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2d0._16_8_;
                local_2d0._0_8_ = (pointer)0x0;
                local_2d0._8_8_ = (pointer)0x0;
                local_2d0._16_8_ = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_f8);
                local_f8._16_8_ =
                     vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_f8._8_8_ =
                     vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_f8._0_8_ =
                     vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pUVar16 = vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start =
                     vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                          ((vector<UniValue,_std::allocator<UniValue>_> *)local_f8);
                std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2d0);
                if ((pointer)local_2f8._8_8_ != (pointer)auStack_2e0) {
                  operator_delete((void *)local_2f8._8_8_,(ulong)(auStack_2e0._0_8_ + 1));
                }
                if (local_318 != &local_308) {
                  operator_delete(local_318,CONCAT71(uStack_307,local_308) + 1);
                }
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&stack0xfffffffffffffae8);
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &pbVar12[1]._M_string_length;
          } while (pbVar12 != pbVar31);
        }
        local_2f8._8_8_ = (pointer)0x4;
        local_2e8._0_5_ = 0x73677261;
        local_2f8._0_8_ = (pointer)local_2e8;
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::extract((node_type *)&local_1e8,
                  (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)__return_storage_ptr__,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
        bVar23 = (byte)((uint)in_stack_fffffffffffffa78 >> 0x18);
        if ((pointer)local_2f8._0_8_ != (pointer)local_2e8) {
          operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
        }
        if ((local_1e8._M_dataplus._M_p != (pointer)0x0) &&
           (pUVar16 = *(pointer *)local_1e8.field_2._M_allocated_capacity,
           *(int *)&pUVar16->typ == 2)) {
          if ((iVar26 < (int)((ulong)((long)(pUVar16->values).
                                            super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pUVar16->values).
                                           super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x45d1745d) &&
             (__rhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f8,"Parameter ",__rhs);
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f8,
                                 " specified twice both as positional and named argument");
            local_2f8._0_8_ = (pbVar12->_M_dataplus)._M_p;
            paVar17 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._0_8_ == paVar17) {
              local_2e8 = (undefined1  [8])paVar17->_M_allocated_capacity;
              auStack_2e0._0_8_ = *(long *)((long)&pbVar12->field_2 + 8);
              local_2f8._0_8_ = (pointer)local_2e8;
            }
            else {
              local_2e8 = (undefined1  [8])paVar17->_M_allocated_capacity;
            }
            local_2f8._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            JSONRPCError(pUVar13,-8,(string *)local_2f8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar13,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00ac595f;
          }
          local_2f8._0_4_ = local_448._0_4_;
          if ((undefined1 *)local_448._8_8_ == local_448 + 0x18) {
            auStack_2e0._8_8_ = local_448._32_8_;
            local_2f8._8_8_ = (pointer)auStack_2e0;
          }
          else {
            local_2f8._8_8_ = local_448._8_8_;
          }
          auStack_2e0._1_7_ = local_448._25_7_;
          auStack_2e0[0] = local_448[0x18];
          local_2e8 = (undefined1  [8])local_448._16_8_;
          local_448._16_8_ = (pointer)0x0;
          local_448[0x18] = '\0';
          local_2d0._0_8_ = local_448._40_8_;
          local_2d0._8_8_ = local_448._48_8_;
          local_2d0._16_8_ = local_448._56_8_;
          local_448._56_8_ = (pointer)0x0;
          local_448._40_8_ = (pointer)0x0;
          local_448._48_8_ = (pointer)0x0;
          vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_448._64_8_;
          vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = pUStack_400;
          vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_3f8;
          pUVar16 = (pointer)(local_448 + 0x40);
          local_3f8 = (pointer)0x0;
          local_448._64_8_ = (pointer)0x0;
          pUStack_400 = (pointer)0x0;
          pVVar4 = *(VType **)local_1e8.field_2._M_allocated_capacity;
          local_448._0_4_ = *pVVar4;
          pUVar29 = pUVar13;
          local_448._8_8_ = local_448 + 0x18;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_448 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (pVVar4 + 2));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_448 + 0x28),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(pVVar4 + 10));
          std::vector<UniValue,_std::allocator<UniValue>_>::operator=
                    ((vector<UniValue,_std::allocator<UniValue>_> *)(local_448 + 0x40),
                     (vector<UniValue,_std::allocator<UniValue>_> *)(pVVar4 + 0x10));
          if ((ulong)((long)pUStack_400 - local_448._64_8_) <
              (ulong)((long)vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                           _M_impl.super__Vector_impl_data._M_start)) {
            index = ((long)pUStack_400 - local_448._64_8_ >> 3) * 0x2e8ba2e8ba2e8ba3;
            do {
              pUVar11 = UniValue::operator[]((UniValue *)local_2f8,index);
              local_370 = pUVar11->typ;
              local_368[0] = local_358;
              pcVar5 = (pUVar11->val)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_368,pcVar5,pcVar5 + (pUVar11->val)._M_string_length);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_348,&pUVar11->keys);
              std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_330,&pUVar11->values);
              val_02._4_4_ = iVar26;
              val_02.typ = in_stack_fffffffffffffa78;
              val_02.val._M_dataplus._M_p = (pointer)__rhs;
              val_02.val._M_string_length = (size_type)this;
              val_02.val.field_2._M_allocated_capacity = (size_type)pUVar9;
              val_02.val.field_2._8_8_ = lVar27;
              val_02.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)request;
              val_02.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)result;
              val_02.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pUVar28;
              val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = pUVar29;
              val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)method;
              val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = pUVar30;
              UniValue::push_back(this,val_02);
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_330);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_348);
              if (local_368[0] != local_358) {
                operator_delete(local_368[0],local_358[0] + 1);
              }
              index = index + 1;
            } while (index < (ulong)(((long)vStack_2b8.
                                            super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)vStack_2b8.
                                            super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3) *
                                    0x2e8ba2e8ba2e8ba3));
          }
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2d0);
          if ((pointer)local_2f8._8_8_ != (pointer)auStack_2e0) {
            operator_delete((void *)local_2f8._8_8_,(ulong)(auStack_2e0._0_8_ + 1));
          }
        }
        if (local_500._24_8_ != 0) {
          pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f8,"Unknown named parameter ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_500._16_8_ + 8));
          JSONRPCError(pUVar13,-8,(string *)local_2f8);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar13,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00ac595f;
        }
        if (local_1e8._M_dataplus._M_p != (pointer)0x0) {
          std::
          _Node_handle_common<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>_>_>
          ::_M_reset((_Node_handle_common<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>_>_>
                      *)&local_1e8);
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_80 + 8)) {
          operator_delete((void *)local_90._8_8_,(ulong)(auStack_78._0_8_ + 1));
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)__return_storage_ptr__);
        local_90[0] = pUVar9 == pUVar28;
        if (*(long *)(lVar27 + 0x50) == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            auVar25 = std::__throw_bad_function_call();
            goto LAB_00ac50ac;
          }
          goto LAB_00ac595f;
        }
        cVar7 = (**(code **)(lVar27 + 0x58))
                          (lVar27 + 0x40,(JSONRPCRequest *)(local_500 + 0x38),result,local_90);
        JSONRPCRequest::~JSONRPCRequest((JSONRPCRequest *)(local_500 + 0x38));
      }
      else {
        local_90[0] = pUVar9 == pUVar28;
        if (*(long *)(lVar27 + 0x50) == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_function_call();
LAB_00ac4eca:
            __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
            std::operator+(&local_1e8,"Parameter ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &(__it._M_cur)->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_UniValue_*>,_true>
                          );
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_1e8," conflicts with parameter ");
            auVar6._8_8_ = local_f8 + 0x10;
            auVar6._0_8_ = pbVar12;
            pcVar5 = (pbVar12->_M_dataplus)._M_p;
            auVar25._8_8_ = pcVar5;
            auVar25._0_8_ = pbVar12;
            pUVar16 = (pointer)&pbVar12->field_2;
            if ((pointer)pcVar5 == pUVar16) {
              local_f8._16_8_ = *(undefined8 *)pUVar16;
              aStack_e0._M_allocated_capacity = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              auVar25 = auVar6;
            }
            else {
LAB_00ac50ac:
              local_f8._16_8_ = *(undefined8 *)pUVar16;
            }
            local_f8._0_8_ = auVar25._8_8_;
            plVar14 = auVar25._0_8_;
            local_f8._8_8_ = plVar14[1];
            *plVar14 = (long)pUVar16;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            pvVar15 = UniValue::getKeys_abi_cxx11_((UniValue *)local_90);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f8,(pvVar15->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
            JSONRPCError(__return_storage_ptr__,-8,(string *)local_2f8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
            }
          }
          goto LAB_00ac595f;
        }
        cVar7 = (**(code **)(lVar27 + 0x58))(lVar27 + 0x40,request,result,local_90);
      }
      RPCCommandExecution::~RPCCommandExecution((RPCCommandExecution *)&stack0xfffffffffffffae0);
      if (cVar7 != '\0') break;
      pUVar9 = (pointer)&pUVar9->val;
      bVar23 = pUVar9 != pUVar30;
    } while ((bool)bVar23);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar23 & 1);
  }
LAB_00ac595f:
  __stack_chk_fail();
}

Assistant:

static bool ExecuteCommands(const std::vector<const CRPCCommand*>& commands, const JSONRPCRequest& request, UniValue& result)
{
    for (const auto& command : commands) {
        if (ExecuteCommand(*command, request, result, &command == &commands.back())) {
            return true;
        }
    }
    return false;
}